

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O1

void __thiscall ImgfsFile::markchunk(ImgfsFile *this,uint64_t ofs,uint size,chunktype_t type)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar6;
  __normal_iterator<ImgfsFile::chunktype_t_*,_std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>_>
  _Var7;
  undefined4 extraout_var_01;
  string *__return_storage_ptr__;
  undefined8 *puVar8;
  ulong __new_size;
  chunktype_t *pcVar9;
  ulong uVar10;
  chunktype_t *pcVar11;
  chunktype_t *pcVar12;
  string str;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  if (size == 0) {
    __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
    stringformat_abi_cxx11_
              (__return_storage_ptr__,"can\'t mark empty chunk @%08llx, \'%c\'",ofs,
               (ulong)(uint)(int)(char)type);
  }
  else {
    iVar4 = (*((this->_rd).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_ReadWriter[6])();
    if ((ofs < CONCAT44(extraout_var,iVar4)) &&
       (iVar4 = (*((this->_rd).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  _vptr_ReadWriter[6])(), size + ofs <= CONCAT44(extraout_var_00,iVar4))) {
      uVar1 = (this->_hdr).bytesperchunk;
      uVar10 = CONCAT44(0,uVar1);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar10;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = ofs;
      uVar6 = SUB168(auVar3 / auVar2,0);
      if (ofs % uVar10 == 0) {
        if (uVar6 >> 0x20 != 0) {
          puVar8 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar8 = "markchunk: offset too large";
          __cxa_throw(puVar8,&char_const*::typeinfo,0);
        }
        uVar5 = (uVar1 - 1 | size - 1) + 1;
        uVar10 = uVar5 / uVar10;
        __new_size = (ulong)(uint)((int)uVar10 + SUB164(auVar3 / auVar2,0));
        if ((ulong)((long)(this->_chunkmap).
                          super__Vector_base<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->_chunkmap).
                         super__Vector_base<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>
                         ._M_impl.super__Vector_impl_data._M_start) < __new_size) {
          local_50 = (undefined1 *)CONCAT71(local_50._1_7_,0x20);
          std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>::resize
                    (&this->_chunkmap,__new_size,(value_type *)&local_50);
        }
        pcVar12 = (this->_chunkmap).
                  super__Vector_base<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar6;
        pcVar9 = pcVar12 + uVar10;
        if ((type != FREECHUNK) &&
           (_Var7 = std::
                    __find_if<__gnu_cxx::__normal_iterator<ImgfsFile::chunktype_t*,std::vector<ImgfsFile::chunktype_t,std::allocator<ImgfsFile::chunktype_t>>>,__gnu_cxx::__ops::_Iter_pred<ImgfsFile::markchunk(unsigned_long,unsigned_int,ImgfsFile::chunktype_t)::_lambda(ImgfsFile::chunktype_t)_1_>>
                              (pcVar12,pcVar9), _Var7._M_current != pcVar9)) {
          printf("markchunk, n=%d, type=%c\n",uVar10,(ulong)(uint)(int)(char)type);
          local_48 = 0;
          local_40 = 0;
          local_50 = &local_40;
          if (uVar1 <= uVar5) {
            pcVar11 = pcVar12;
            do {
              std::__cxx11::string::push_back((char)&local_50);
              pcVar11 = pcVar11 + 1;
            } while (pcVar11 != pcVar9);
          }
          printf("chunk %08llx+%08x is already: \'%s\'\n",ofs,(ulong)uVar5,local_50);
          if (local_50 != &local_40) {
            operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
          }
        }
        if (uVar1 <= uVar5) {
          do {
            *pcVar12 = type;
            pcVar12 = pcVar12 + 1;
          } while (pcVar12 != pcVar9);
        }
        return;
      }
      __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
      stringformat_abi_cxx11_(__return_storage_ptr__,"unaligned chunk @%08llx",ofs);
    }
    else {
      __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
      iVar4 = (*((this->_rd).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_ReadWriter[6])();
      stringformat_abi_cxx11_
                (__return_storage_ptr__,"chunk @%08llx+%08x outside of file [filesize=%llx]",ofs,
                 (ulong)size,CONCAT44(extraout_var_01,iVar4));
    }
  }
  __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void markchunk(uint64_t ofs, unsigned size, chunktype_t type)
    {
        if (size==0)
            throw stringformat("can't mark empty chunk @%08llx, '%c'", ofs, type);
        if (ofs>=_rd->size() || ofs+size > _rd->size())
            throw stringformat("chunk @%08llx+%08x outside of file [filesize=%llx]", ofs, size, _rd->size());
        if (ofs%_hdr.bytesperchunk)
            throw stringformat("unaligned chunk @%08llx", ofs);

        size= roundtochunk(size);

        if ((ofs/_hdr.bytesperchunk)>>32)
            throw "markchunk: offset too large";
        unsigned ix= unsigned(ofs/_hdr.bytesperchunk);
        unsigned n= size/_hdr.bytesperchunk;
        if (_chunkmap.size()<ix+n)
            _chunkmap.resize(ix+n, FREECHUNK);

        chunkmap_t::iterator begin= _chunkmap.begin()+ix;
        chunkmap_t::iterator end= _chunkmap.begin()+ix+n;

        // note: msvc10 requires the explicit class scope ImgfsFile  for FREECHUNK
        if (type!=FREECHUNK && std::find_if(begin, end, [](chunktype_t t) { return t!=ImgfsFile::FREECHUNK; })!=end) {
            printf("markchunk, n=%d, type=%c\n", n, type);
            std::string str;
            std::for_each(begin, end, [&str](chunktype_t t){ str += (char)t; });
            printf("chunk %08llx+%08x is already: '%s'\n", ofs, size, str.c_str());

            // is 'str' correct, while the string below is not,
            //    -> because i did not declare the enum as ':char'
            //printf("chunk %08llx+%08x is already: '%s'\n", ofs, size, std::string((const char*)&(*begin), n).c_str());
        }
        std::fill_n(begin, n, type);
    }